

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_shared.h
# Opt level: O1

void Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::initialize
               (Characteristic characteristic)

{
  pointer puVar1;
  uint uVar2;
  invalid_argument *this;
  int iVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  if (characteristic < 2) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this,"Characteristic must be strictly positive and a prime number.");
LAB_00115771:
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&inverse_,(ulong)characteristic);
  puVar1 = inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  iVar3 = characteristic - 1;
  uVar4 = 1;
  iVar5 = 2;
  do {
    uVar6 = 1;
    if (uVar4 != 1) {
      iVar7 = 0;
      do {
        if (iVar3 == iVar7) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this,"Characteristic must be a prime number.");
          goto LAB_00115771;
        }
        uVar6 = uVar6 + 1;
        uVar2 = iVar5 + iVar7;
        iVar7 = iVar7 + (int)uVar4;
      } while (uVar2 % characteristic != 1);
    }
    puVar1[uVar4] = uVar6;
    uVar4 = uVar4 + 1;
    iVar3 = iVar3 + -1;
    iVar5 = iVar5 + 2;
    if (uVar4 == characteristic) {
      characteristic_ = characteristic;
      return;
    }
  } while( true );
}

Assistant:

static void initialize(Characteristic characteristic) {
    if (characteristic <= 1)
      throw std::invalid_argument("Characteristic must be strictly positive and a prime number.");

    inverse_.resize(characteristic);
    inverse_[0] = 0;
    for (Element i = 1; i < characteristic; ++i) {
      Element inv = 1;
      Element mult = inv * i;
      while ((mult % characteristic) != 1) {
        ++inv;
        if (mult == characteristic) throw std::invalid_argument("Characteristic must be a prime number.");
        mult = inv * i;
      }
      inverse_[i] = inv;
    }

    characteristic_ = characteristic;
  }